

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,VcsolutionDepend*>::emplace_helper<VcsolutionDepend*const&>
          (QHash<QString,_VcsolutionDepend_*> *this,QString *key,VcsolutionDepend **args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<QString,_VcsolutionDepend_*> *in_RDX;
  Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_>::findOrInsert<QString>
            (in_RSI,&in_RDX->key);
  QHashPrivate::iterator<QHashPrivate::Node<QString,_VcsolutionDepend_*>_>::node
            ((iterator<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *)in_RDX);
  QHashPrivate::Node<QString,VcsolutionDepend*>::createInPlace<VcsolutionDepend*const&>
            (in_RDX,in_stack_ffffffffffffff98,(VcsolutionDepend **)in_stack_ffffffffffffff90);
  it.bucket = (size_t)in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<QString,_VcsolutionDepend_*>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }